

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswInt.h
# Opt level: O0

Aig_Obj_t * Csw_ObjChild0Equiv(Csw_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_20;
  Aig_Obj_t *pObj_local;
  Csw_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 == 0) {
    pAVar2 = Aig_ObjFanin0(pObj);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      local_20 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = Aig_ObjFanin0(pObj);
      pAVar2 = Csw_ObjEquiv(p,pAVar2);
      iVar1 = Aig_ObjFaninC0(pObj);
      local_20 = Aig_NotCond(pAVar2,iVar1);
    }
    return local_20;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/csw/cswInt.h"
                ,0x74,"Aig_Obj_t *Csw_ObjChild0Equiv(Csw_Man_t *, Aig_Obj_t *)");
}

Assistant:

static inline Aig_Obj_t *  Csw_ObjChild0Equiv( Csw_Man_t * p, Aig_Obj_t * pObj ) { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin0(pObj)? Aig_NotCond(Csw_ObjEquiv(p, Aig_ObjFanin0(pObj)), Aig_ObjFaninC0(pObj)) : NULL;  }